

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaBlockVector::AllocateFromBlock
          (VmaBlockVector *this,VmaDeviceMemoryBlock *pBlock,VkDeviceSize size,
          VkDeviceSize alignment,VmaAllocationCreateFlags allocFlags,void *pUserData,
          VmaSuballocationType suballocType,uint32_t strategy,VmaAllocation *pAllocation)

{
  ulong uVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  VmaAllocation *in_RSI;
  uint in_R8D;
  VmaBlockVector *in_R9;
  byte bVar2;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  VmaAllocationRequest currRequest;
  bool isUpperAddress;
  undefined8 local_78;
  undefined8 local_70;
  VmaListItem<VmaSuballocation> *in_stack_ffffffffffffffa0;
  VmaAllocationCreateFlags allocFlags_00;
  VkDeviceSize alignment_00;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  VkResult local_4;
  
  bVar2 = (in_R8D & 0x40) != 0;
  local_78 = 0;
  local_70 = 0;
  VmaList<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::iterator::iterator
            ((iterator *)&stack0xffffffffffffff98);
  allocFlags_00 = 0;
  alignment_00 = 0;
  uVar3 = 0;
  uVar1 = (**(code **)((long)&((((*in_RSI)->field_0).m_DedicatedAllocation.m_hParentPool)->
                              m_BlockVector).m_Mutex.m_Mutex._M_impl._M_rwlock + 0x30))
                    (*in_RSI,in_RDX,in_RCX,bVar2 & 1,in_stack_00000008,in_stack_00000010,&local_78);
  if ((uVar1 & 1) == 0) {
    local_4 = VK_ERROR_OUT_OF_DEVICE_MEMORY;
  }
  else {
    local_4 = CommitAllocationRequest
                        (in_R9,(VmaAllocationRequest *)CONCAT17(bVar2,in_stack_ffffffffffffffc0),
                         (VmaDeviceMemoryBlock *)CONCAT44(in_stack_ffffffffffffffbc,uVar3),
                         alignment_00,allocFlags_00,in_stack_ffffffffffffffa0,
                         (VmaSuballocationType)in_RDX,in_RSI);
  }
  return local_4;
}

Assistant:

VkResult VmaBlockVector::AllocateFromBlock(
    VmaDeviceMemoryBlock* pBlock,
    VkDeviceSize size,
    VkDeviceSize alignment,
    VmaAllocationCreateFlags allocFlags,
    void* pUserData,
    VmaSuballocationType suballocType,
    uint32_t strategy,
    VmaAllocation* pAllocation)
{
    const bool isUpperAddress = (allocFlags & VMA_ALLOCATION_CREATE_UPPER_ADDRESS_BIT) != 0;

    VmaAllocationRequest currRequest = {};
    if (pBlock->m_pMetadata->CreateAllocationRequest(
        size,
        alignment,
        isUpperAddress,
        suballocType,
        strategy,
        &currRequest))
    {
        return CommitAllocationRequest(currRequest, pBlock, alignment, allocFlags, pUserData, suballocType, pAllocation);
    }
    return VK_ERROR_OUT_OF_DEVICE_MEMORY;
}